

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

size_t __thiscall roaring::Roaring64Map::getSizeInBytes(Roaring64Map *this,bool portable)

{
  const_iterator __first;
  unsigned_long uVar1;
  undefined1 in_SIL;
  undefined8 in_RDI;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_stack_ffffffffffffffc8;
  anon_class_1_1_135c2ad9 __binary_op;
  undefined7 in_stack_ffffffffffffffd8;
  
  __binary_op.portable = SUB81((ulong)in_RDI >> 0x38,0);
  std::
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::cbegin(in_stack_ffffffffffffffc8);
  __first = std::
            map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
            ::cend(in_stack_ffffffffffffffc8);
  std::
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::size((map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
          *)0x1144ff);
  uVar1 = std::
          accumulate<std::_Rb_tree_const_iterator<std::pair<unsigned_int_const,roaring::Roaring>>,unsigned_long,roaring::Roaring64Map::getSizeInBytes(bool)const::_lambda(unsigned_long,std::pair<unsigned_int_const,roaring::Roaring>const&)_1_>
                    ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>)
                     __first._M_node,
                     (_Base_ptr)(CONCAT17(in_SIL,in_stack_ffffffffffffffd8) & 0x1ffffffffffffff),
                     (unsigned_long)in_stack_ffffffffffffffc8,__binary_op);
  return uVar1;
}

Assistant:

size_t getSizeInBytes(bool portable = true) const {
        // start with, respectively, map size and size of keys for each map
        // entry
        return std::accumulate(
            roarings.cbegin(), roarings.cend(),
            sizeof(uint64_t) + roarings.size() * sizeof(uint32_t),
            [=](size_t previous,
                const std::pair<const uint32_t, Roaring> &map_entry) {
                // add in bytes used by each Roaring
                return previous + map_entry.second.getSizeInBytes(portable);
            });
    }